

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int xmlInvokeConvImpl(xmlCharEncConvImpl impl,void *implCtxt,char *name,
                     xmlCharEncodingHandler *handler)

{
  int iVar1;
  xmlCharEncConverter conv;
  xmlCharEncConverter local_38;
  
  local_38.ctxtDtor = (xmlCharEncConvCtxtDtor)0x0;
  local_38.inputCtxt = (void *)0x0;
  local_38.input = (xmlCharEncConvFunc)0x0;
  local_38.output = (xmlCharEncConvFunc)0x0;
  local_38.outputCtxt = (void *)0x0;
  iVar1 = (*impl)(implCtxt,name,&local_38);
  if (iVar1 == 0) {
    handler->input = (xmlCharEncodingInputFunc)local_38.input;
    handler->output = (xmlCharEncodingOutputFunc)local_38.output;
    handler->ctxtDtor = local_38.ctxtDtor;
    handler->inputCtxt = local_38.inputCtxt;
    handler->outputCtxt = local_38.outputCtxt;
  }
  return iVar1;
}

Assistant:

static int
xmlInvokeConvImpl(xmlCharEncConvImpl impl, void *implCtxt,
                  const char *name, xmlCharEncodingHandler *handler) {
    xmlCharEncConverter conv = { NULL, NULL, NULL, NULL, NULL };
    int ret;

    ret = impl(implCtxt, name, &conv);

    if (ret == XML_ERR_OK) {
        handler->input =
            (xmlCharEncodingInputFunc) (void (*)(void)) conv.input;
        handler->output =
            (xmlCharEncodingOutputFunc) (void (*)(void)) conv.output;
        handler->ctxtDtor = conv.ctxtDtor;
        handler->inputCtxt = conv.inputCtxt;
        handler->outputCtxt = conv.outputCtxt;
    }

    return(ret);
}